

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_impls.cxx
# Opt level: O3

void __thiscall test_rpc_client::~test_rpc_client(test_rpc_client *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_rpc_client)._vptr_rpc_client = (_func_int **)&PTR__test_rpc_client_00176df8;
  pcVar2 = (this->port_)._M_dataplus._M_p;
  paVar1 = &(this->port_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

test_rpc_client(msg_bus& bus, const std::string& port) : bus_(bus), port_(port)
    {
    }